

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

bool __thiscall
dap::
BasicTypeInfo<std::vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_>_>
::deserialize(BasicTypeInfo<std::vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_>_>
              *this,Deserializer *d,void *ptr)

{
  int iVar1;
  undefined4 extraout_var;
  size_t i;
  vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_> **local_48;
  undefined8 *puStack_40;
  code *local_38;
  code *pcStack_30;
  undefined8 local_20;
  vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_> *local_18;
  
  local_18 = (vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_> *)
             ptr;
  iVar1 = (*d->_vptr_Deserializer[8])(d);
  std::vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_>::resize
            (local_18,CONCAT44(extraout_var,iVar1));
  puStack_40 = &local_20;
  local_20 = 0;
  pcStack_30 = std::
               _Function_handler<bool_(dap::Deserializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:98:14)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(dap::Deserializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:98:14)>
             ::_M_manager;
  local_48 = &local_18;
  iVar1 = (*d->_vptr_Deserializer[9])(d);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return SUB41(iVar1,0);
}

Assistant:

inline bool deserialize(const Deserializer* d, void* ptr) const override {
    return d->deserialize(reinterpret_cast<T*>(ptr));
  }